

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

bool __thiscall
upb::generator::reflection::ReflectionGenerator::GenerateAll
          (ReflectionGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  FileDescriptor *file_00;
  bool bVar1;
  reference ppFVar2;
  FileDefPtr file_01;
  string_view sVar3;
  FileDefPtr upb_file;
  FileDescriptor *file;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *__range3;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files_seen;
  DefPoolPair pools;
  Arena arena;
  undefined1 local_58 [8];
  Options options;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  ReflectionGenerator *this_local;
  
  options.dllexport_decl.field_2._8_8_ = error;
  Options::Options((Options *)local_58);
  sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)parameter)
  ;
  bVar1 = ParseOptions(sVar3,(Options *)local_58,(string *)options.dllexport_decl.field_2._8_8_);
  if (bVar1) {
    Arena::Arena((Arena *)((long)&pools.pool64_.ptr_._M_t.
                                  super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                                  super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)> + 8
                          ));
    DefPoolPair::DefPoolPair
              ((DefPoolPair *)
               ((long)&files_seen.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    absl::lts_20250127::
    flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range3);
    __end3 = std::
             vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::begin(files);
    file = (FileDescriptor *)
           std::
           vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::end(files);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                  *)&file);
      if (!bVar1) break;
      ppFVar2 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                ::operator*(&__end3);
      file_00 = *ppFVar2;
      PopulateDefPool(file_00,(Arena *)((long)&pools.pool64_.ptr_._M_t.
                                               super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)>
                                       + 8),
                      (DefPoolPair *)
                      ((long)&files_seen.
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                              .value.heap_or_soo_ + 8),
                      (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3);
      sVar3 = google::protobuf::FileDescriptor::name(file_00);
      file_01 = DefPoolPair::GetFile
                          ((DefPoolPair *)
                           ((long)&files_seen.
                                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .settings_.
                                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                   .
                                   super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                   .value.heap_or_soo_ + 8),sVar3);
      GenerateFile(file_01,(Options *)local_58,generator_context);
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    this_local._7_1_ = true;
    absl::lts_20250127::
    flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~flat_hash_set((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3);
    DefPoolPair::~DefPoolPair
              ((DefPoolPair *)
               ((long)&files_seen.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    Arena::~Arena((Arena *)((long)&pools.pool64_.ptr_._M_t.
                                   super___uniq_ptr_impl<upb_DefPool,_void_(*)(upb_DefPool_*)>._M_t.
                                   super__Tuple_impl<0UL,_upb_DefPool_*,_void_(*)(upb_DefPool_*)> +
                           8));
  }
  else {
    this_local._7_1_ = false;
  }
  Options::~Options((Options *)local_58);
  return this_local._7_1_;
}

Assistant:

bool GenerateAll(const std::vector<const google::protobuf::FileDescriptor*>& files,
                   const std::string& parameter,
                   google::protobuf::compiler::GeneratorContext* generator_context,
                   std::string* error) const override {
    Options options;
    if (!ParseOptions(parameter, &options, error)) {
      return false;
    }

    upb::Arena arena;
    DefPoolPair pools;
    absl::flat_hash_set<std::string> files_seen;
    for (const auto* file : files) {
      PopulateDefPool(file, &arena, &pools, &files_seen);
      upb::FileDefPtr upb_file = pools.GetFile(file->name());
      GenerateFile(upb_file, options, generator_context);
    }

    return true;
  }